

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x64.c
# Opt level: O0

void asm_allocate_registers(Trace *trace)

{
  IrIns *pIVar1;
  bool bVar2;
  int local_54;
  int reg_1;
  _Bool found_reg;
  int reg;
  IrIns *ins;
  ushort local_38 [3];
  IrRef ins_ref;
  IrRef reg_end [16];
  IrRef *live_ranges;
  Trace *trace_local;
  
  reg_end._24_8_ = calloc((long)trace->ir_count,2);
  asm_calculate_live_ranges(trace,(IrRef *)reg_end._24_8_);
  memset(local_38,0,0x20);
  ins._6_2_ = 1;
  do {
    if (trace->ir_count <= (int)(uint)ins._6_2_) {
      return;
    }
    pIVar1 = trace->ir;
    for (reg_1 = 0; reg_1 < 0x10; reg_1 = reg_1 + 1) {
      if (local_38[reg_1] == ins._6_2_) {
        local_38[reg_1] = 0;
      }
    }
    bVar2 = false;
    for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
      if (local_38[local_54] == 0) {
        bVar2 = true;
        ir_set_reg(pIVar1 + ins._6_2_,(uint16_t)local_54);
        local_38[local_54] = *(ushort *)(reg_end._24_8_ + (ulong)ins._6_2_ * 2);
        break;
      }
    }
    if (!bVar2) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/benanders[P]Hydrogen/src/jit/asm/x64.c"
                    ,0x7a,"void asm_allocate_registers(Trace *)");
    }
    ins._6_2_ = ins._6_2_ + 1;
  } while( true );
}

Assistant:

static void asm_allocate_registers(Trace *trace) {
	// Calculate the live range of each instruction. Use calloc because this 
	// initialises all live ranges to 0, the equivalent of IR_NONE.
	IrRef *live_ranges = calloc(trace->ir_count, sizeof(IrRef));
	asm_calculate_live_ranges(trace, live_ranges);

	// Keep track of when each register is no longer in use
	IrRef reg_end[HY_ARCH_NUM_REGS] = {IR_NONE};

	// Iterate over the instructions in order
	for (IrRef ins_ref = 1; ins_ref < trace->ir_count; ins_ref++) {
		IrIns *ins = &trace->ir[ins_ref];

		// Free any registers that finish being used at this instruction by
		// iterating over all the registers
		for (int reg = 0; reg < HY_ARCH_NUM_REGS; reg++) {
			// If this register's live range ends at this instruction, free it
			// from being used
			if (reg_end[reg] == ins_ref) {
				reg_end[reg] = IR_NONE;
			}
		}

		// Find the next register that's not in use
		bool found_reg = false;
		for (int reg = 0; reg < HY_ARCH_NUM_REGS; reg++) {
			// Check to see if this register isn't already in use
			if (reg_end[reg] == IR_NONE) {
				found_reg = true;

				// Use this register for the result of this instruction
				ir_set_reg(ins, reg);

				// The use of this register ends when this instruction's live
				// range ends
				reg_end[reg] = live_ranges[ins_ref];
				break;
			}
		}

		// If we couldn't find a register to allocate to the result of this
		// instruction, then spill a register to memory
		if (!found_reg) {
			// TODO: register spilling (we assume for now that we have enough
			// registers to satisfy all instruction live ranges, i.e. no more
			// than HY_ARCH_NUM_REGS will be in use at any time)
			assert(false);
		}
	}
}